

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

QString * Qt::Literals::StringLiterals::operator____s(char16_t *str,size_t size)

{
  qsizetype in_RDX;
  char16_t *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  DataPointer *in_stack_ffffffffffffffa8;
  QArrayDataPointer<char16_t> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_20,(Data *)0x0,in_RSI,in_RDX);
  QString::QString((QString *)in_RDI,in_stack_ffffffffffffffa8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QString operator""_s(const char16_t *str, size_t size) noexcept
{
    return QString(QStringPrivate(nullptr, const_cast<char16_t *>(str), qsizetype(size)));
}